

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

StringNew * __thiscall
wasm::Builder::makeStringNew
          (Builder *this,StringNewOp op,Expression *ref,Expression *start,Expression *end)

{
  StringNew *this_00;
  
  if ((op != StringNewFromCodePoint) == (end != (Expression *)0x0 && start != (Expression *)0x0)) {
    this_00 = MixedArena::alloc<wasm::StringNew>(&this->wasm->allocator);
    this_00->op = op;
    this_00->ref = ref;
    this_00->start = start;
    this_00->end = end;
    StringNew::finalize(this_00);
    return this_00;
  }
  __assert_fail("(start && end) != (op == StringNewFromCodePoint)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-builder.h"
                ,0x461,
                "StringNew *wasm::Builder::makeStringNew(StringNewOp, Expression *, Expression *, Expression *)"
               );
}

Assistant:

StringNew* makeStringNew(StringNewOp op,
                           Expression* ref,
                           Expression* start = nullptr,
                           Expression* end = nullptr) {
    assert((start && end) != (op == StringNewFromCodePoint));
    auto* ret = wasm.allocator.alloc<StringNew>();
    ret->op = op;
    ret->ref = ref;
    ret->start = start;
    ret->end = end;
    ret->finalize();
    return ret;
  }